

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O3

int surv0_ctx_set_survey_time(void *arg,void *buf,size_t sz,nni_opt_type t)

{
  int iVar1;
  int local_1c [2];
  nng_duration expire;
  
  iVar1 = nni_copyin_ms(local_1c,buf,sz,t);
  if (iVar1 == 0) {
    nni_atomic_set((nni_atomic_int *)((long)arg + 0x74),local_1c[0]);
  }
  return iVar1;
}

Assistant:

static int
surv0_ctx_set_survey_time(
    void *arg, const void *buf, size_t sz, nni_opt_type t)
{
	surv0_ctx   *ctx = arg;
	nng_duration expire;
	int          rv;
	if ((rv = nni_copyin_ms(&expire, buf, sz, t)) == 0) {
		nni_atomic_set(&ctx->survey_time, expire);
	}
	return (rv);
}